

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_unique_ptr.hpp
# Opt level: O3

unique_ptr<Catch::Generators::Generators<std::tuple<float,_float,_float>_>_> __thiscall
Catch::Detail::
make_unique<Catch::Generators::Generators<std::tuple<float,float,float>>,Catch::Generators::Generators<std::tuple<float,float,float>>>
          (Detail *this,Generators<std::tuple<float,_float,_float>_> *args)

{
  pointer pcVar1;
  pointer pGVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x50);
  *puVar3 = &PTR___cxa_pure_virtual_004f67d0;
  puVar3[1] = puVar3 + 3;
  pcVar1 = (args->super_IGenerator<std::tuple<float,_float,_float>_>).super_GeneratorUntypedBase.
           m_stringReprCache._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar3 + 1),pcVar1,
             pcVar1 + (args->super_IGenerator<std::tuple<float,_float,_float>_>).
                      super_GeneratorUntypedBase.m_stringReprCache._M_string_length);
  puVar3[5] = (args->super_IGenerator<std::tuple<float,_float,_float>_>).super_GeneratorUntypedBase.
              m_currentElementIndex;
  *puVar3 = &PTR_next_004efbb8;
  pGVar2 = (args->m_generators).
           super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3[6] = (args->m_generators).
              super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puVar3[7] = pGVar2;
  puVar3[8] = (args->m_generators).
              super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3[9] = args->m_current;
  *(undefined8 **)this = puVar3;
  return (unique_ptr<Catch::Generators::Generators<std::tuple<float,_float,_float>_>_>)
         (Generators<std::tuple<float,_float,_float>_> *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }